

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O2

void __thiscall disruptor::test::SequenceBarrier::WaitForCursor::test_method(WaitForCursor *this)

{
  thread waiter2;
  __atomic_base<long> local_100;
  thread waiter;
  atomic<long> return_value;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_e8 = (undefined **)operator_new(0x18);
  *local_e8 = (undefined *)&PTR___State_00108c58;
  local_e8[1] = (undefined *)this;
  local_e8[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_e8,0);
  if (local_e8 != (undefined **)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x46);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00108bc8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_58 = "";
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_e8,&local_60,0x46,1,2,&waiter2,"return_value.load()",&kInitialCursorValue,
             "kInitialCursorValue");
  waiter2._M_id._M_thread = (id)0;
  local_e8 = (undefined **)operator_new(0x10);
  *local_e8 = (undefined *)&PTR___State_00108cb8;
  local_e8[1] = (undefined *)this;
  std::thread::_M_start_thread(&waiter2,&local_e8,0);
  if (local_e8 != (undefined **)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  std::thread::join();
  std::thread::~thread(&waiter2);
  std::thread::join();
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x49);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00108bc8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_88 = "";
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_e8,&local_90,0x49,1,2,&waiter2,"return_value.load()",&kFirstSequenceValue,
             "kFirstSequenceValue");
  waiter2._M_id._M_thread = (id)0;
  local_e8 = (undefined **)operator_new(0x18);
  *local_e8 = (undefined *)&PTR___State_00108cf8;
  local_e8[1] = (undefined *)this;
  local_e8[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter2,&local_e8,0);
  if (local_e8 != (undefined **)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_100._M_i = 0;
  local_e8 = (undefined **)operator_new(0x10);
  *local_e8 = (undefined *)&PTR___State_00108d38;
  local_e8[1] = (undefined *)this;
  std::thread::_M_start_thread(&local_100,&local_e8,0);
  if (local_e8 != (undefined **)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  std::thread::join();
  std::thread::~thread((thread *)&local_100);
  std::thread::join();
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x53);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00108bc8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_b8 = "";
  local_100 = return_value.super___atomic_base<long>._M_i;
  local_c8 = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_e8,&local_c0,0x53,1,2,&local_100,"return_value.load()",&local_c8,
             "kFirstSequenceValue + 1L");
  std::thread::~thread(&waiter2);
  std::thread::~thread(&waiter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}